

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O2

PCAPNG_RESULT pcapng_append_interface_option(PCAPNG_HANDLE *handle,option_header *interface_option)

{
  ushort uVar1;
  PCAPNG_RESULT PVar2;
  size_t sVar3;
  
  PVar2 = PCAPNG_INVALID_HANDLE;
  if ((handle != (PCAPNG_HANDLE *)0x0) && (handle->fd != -1)) {
    PVar2 = PCAPNG_NO_MEMORY;
    if (((undefined1 *)0x1 < (undefined1 *)((long)&handle->interface_description->block_type + 1U))
       && (interface_option != (option_header *)0x0 && handle->next_interface_option_offset != 0)) {
      uVar1 = interface_option->option_length;
      memcpy((void *)((long)&handle->interface_description->block_type +
                     handle->next_interface_option_offset),interface_option,(ulong)uVar1 + 4);
      sVar3 = (ulong)(uVar1 + 7 & 0xfffffffc) + handle->next_interface_option_offset;
      handle->next_interface_option_offset = sVar3;
      padopt.option_length = ((short)(int)handle->interface_description_size - (short)sVar3) - 0xc;
      *(option_header *)((long)&handle->interface_description->block_type + sVar3) = padopt;
      PVar2 = PCAPNG_OK;
    }
  }
  return PVar2;
}

Assistant:

PCAPNG_RESULT pcapng_append_interface_option( PCAPNG_HANDLE * handle,
					      const option_header * interface_option )
{
	PCAPNG_RESULT retval = PCAPNG_OK;
	if (handle && (handle->fd != -1)) {
		if (handle->interface_description &&
		    (handle->interface_description != MAP_FAILED) &&
		    handle->next_interface_option_offset &&
		    interface_option) {
			size_t copysz = 4+interface_option->option_length;
			uint8_t * dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			(void) memcpy( dest, interface_option, copysz );
			handle->next_interface_option_offset += 4*((copysz+3)/4);

			/* update padding option */
			dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			padopt.option_length = handle->interface_description_size -
				handle->next_interface_option_offset - 12;
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
		}
		else {
			retval = PCAPNG_NO_MEMORY;
		}
	}
	else {
		retval = PCAPNG_INVALID_HANDLE;
	}
	return retval;
}